

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O2

void yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>::
     _throwLowerGtUpper<long_long,unsigned_long_long>
               (longlong lower,unsigned_long_long upper,TextLocation *loc)

{
  string msg;
  ostream *poVar1;
  undefined8 in_stack_fffffffffffffe40;
  TextLocation in_stack_fffffffffffffe48;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar1 = std::ostream::_M_insert<long_long>((longlong)&ss);
  poVar1 = std::operator<<(poVar1," is greater than ");
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  std::operator<<(poVar1,'.');
  std::__cxx11::stringbuf::str();
  msg.field_2._8_8_ = in_stack_fffffffffffffe40;
  msg._0_24_ = *loc;
  throwTextParseError(msg,in_stack_fffffffffffffe48);
}

Assistant:

static void _throwLowerGtUpper(const LowerT lower, const UpperT upper, const TextLocation& loc)
    {
        std::ostringstream ss;

        ss << lower << " is greater than " << upper << '.';
        throwTextParseError(ss.str(), loc);
    }